

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall wasm::TranslateToFuzzReader::makeImportLogging(TranslateToFuzzReader *this)

{
  string_view target;
  mapped_type *pmVar1;
  Call *pCVar2;
  initializer_list<wasm::Expression_*> __l;
  Type local_58;
  Type type;
  Expression *local_38;
  allocator_type local_29;
  
  local_58 = getLoggableType(this);
  pmVar1 = std::__detail::
           _Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_wasm::Name>,_std::allocator<std::pair<const_wasm::Type,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&this->logImportNames,&local_58);
  target = (pmVar1->super_IString).str;
  local_38 = make(this,local_58);
  __l._M_len = 1;
  __l._M_array = &local_38;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type,__l,&local_29)
  ;
  pCVar2 = Builder::makeCall(&this->builder,(Name)target,
                             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                             &type,(Type)0x0,false);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&type);
  return (Expression *)pCVar2;
}

Assistant:

Expression* TranslateToFuzzReader::makeImportLogging() {
  auto type = getLoggableType();
  return builder.makeCall(logImportNames[type], {make(type)}, Type::none);
}